

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     UniversalPrinter<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<false>_>::Print
               (iterator_base<false> *value,ostream *os)

{
  ostream *os_local;
  iterator_base<false> *value_local;
  
  PrintTo<pstore::chunked_sequence<int,2ul,4ul,4ul>::iterator_base<false>>(value,os);
  return;
}

Assistant:

static void Print(const T& value, ::std::ostream* os) {
    // By default, ::testing::internal::PrintTo() is used for printing
    // the value.
    //
    // Thanks to Koenig look-up, if T is a class and has its own
    // PrintTo() function defined in its namespace, that function will
    // be visible here.  Since it is more specific than the generic ones
    // in ::testing::internal, it will be picked by the compiler in the
    // following statement - exactly what we want.
    PrintTo(value, os);
  }